

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::MetallicPaintMaterial::MetallicPaintMaterial
          (MetallicPaintMaterial *this,Vec3fa *shadeColor,Vec3fa *glitterColor,float glitterSpread,
          float eta)

{
  size_type sVar1;
  size_type *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  allocator *this_00;
  allocator local_61;
  string local_60 [32];
  undefined4 local_40;
  undefined4 local_3c;
  size_type *local_38;
  undefined8 *local_30;
  
  this_00 = &local_61;
  local_40 = in_XMM1_Da;
  local_3c = in_XMM0_Da;
  local_38 = in_RDX;
  local_30 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",this_00);
  SceneGraph::MaterialNode::MaterialNode((MaterialNode *)this_00,in_RDI);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  *(undefined ***)in_RDI = &PTR__MetallicPaintMaterial_005fea78;
  Material::Material((Material *)&in_RDI[3].field_2,MATERIAL_METALLIC_PAINT);
  sVar1 = local_30[1];
  *(undefined8 *)(in_RDI + 4) = *local_30;
  in_RDI[4]._M_string_length = sVar1;
  sVar1 = local_38[1];
  in_RDI[4].field_2._M_allocated_capacity = *local_38;
  *(size_type *)((long)&in_RDI[4].field_2 + 8) = sVar1;
  *(undefined4 *)(in_RDI + 5) = local_3c;
  *(undefined4 *)&in_RDI[5].field_0x4 = local_40;
  return;
}

Assistant:

MetallicPaintMaterial (const Vec3fa& shadeColor, const Vec3fa& glitterColor, float glitterSpread, float eta)
      : base(MATERIAL_METALLIC_PAINT), shadeColor(shadeColor), glitterColor(glitterColor), glitterSpread(glitterSpread), eta(eta) {}